

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

void fire_effect(void *vo,int level,int dam,int target)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  CHAR_DATA *ch;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  char *msg;
  int chance;
  OBJ_DATA *n_obj;
  OBJ_DATA *t_obj;
  OBJ_DATA *obj_2;
  AFFECT_DATA af;
  OBJ_DATA *obj_next_1;
  OBJ_DATA *obj_1;
  CHAR_DATA *victim;
  OBJ_DATA *obj_next;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *room;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  int iVar6;
  CHAR_DATA *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  int iVar7;
  undefined8 in_stack_ffffffffffffff40;
  OBJ_DATA *obj_00;
  CHAR_DATA *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  CHAR_DATA *in_stack_ffffffffffffff90;
  long local_40;
  long local_28;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (in_ECX == 2) {
    local_28 = *(long *)(in_RDI + 0x20);
    iVar3 = 2;
    while (local_28 != 0) {
      local_28 = *(long *)(local_28 + 8);
      fire_effect((void *)CONCAT44(in_ESI,in_EDX),iVar3,in_stack_ffffffffffffffe8,
                  (int)((ulong)in_RDI >> 0x20));
    }
  }
  else if (in_ECX == 0) {
    bVar2 = is_affected_by(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    if ((!bVar2) &&
       (bVar2 = saves_spell(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,iVar3), !bVar2)) {
      act((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          in_stack_ffffffffffffff18,
          (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
          (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
      act((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
          in_stack_ffffffffffffff18,
          (void *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
          (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
      init_affect((AFFECT_DATA *)0x5cf6b2);
      in_stack_ffffffffffffff88 = 0;
      skill_lookup((char *)in_stack_ffffffffffffff18);
      number_range(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      std::pow<int,int>(0,0x5cf718);
      affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    bVar2 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (!bVar2) {
      gain_condition(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    }
    local_40 = *(long *)(in_RDI + 0x98);
    while (local_40 != 0) {
      local_40 = *(long *)(local_40 + 8);
      fire_effect((void *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
                  (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
  }
  else if ((((in_ECX == 1) &&
            (bVar2 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14),
            !bVar2)) &&
           (bVar2 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14),
           !bVar2)) &&
          (iVar3 = number_range(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c), iVar3 != 0)) {
    iVar4 = in_ESI / 4;
    iVar3 = iVar4 + in_EDX / 10;
    if (0x19 < iVar3) {
      iVar3 = (iVar3 + -0x19) / 2 + 0x19;
    }
    if (0x32 < iVar3) {
      iVar3 = (iVar3 + -0x32) / 2 + 0x32;
    }
    bVar2 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
    if (bVar2) {
      iVar3 = iVar3 + -5;
    }
    iVar3 = iVar3 + *(short *)(in_RDI + 0x108) * -2;
    ch = (CHAR_DATA *)(ulong)((int)*(short *)(in_RDI + 0x98) - 2);
    switch(ch) {
    case (CHAR_DATA *)0x0:
      iVar3 = iVar3 + 0x32;
      break;
    case (CHAR_DATA *)0x1:
      break;
    case (CHAR_DATA *)0x2:
      iVar3 = iVar3 + 10;
      break;
    default:
      return;
    case (CHAR_DATA *)0x8:
      iVar3 = iVar3 + 0x19;
      break;
    case (CHAR_DATA *)0xd:
      break;
    case (CHAR_DATA *)0x11:
      break;
    case (CHAR_DATA *)0x18:
    }
    if (iVar3 < 5) {
      iVar3 = in_stack_ffffffffffffff10;
      iVar6 = 5;
    }
    else {
      iVar6 = iVar3;
      if (0x5f < iVar3) {
        iVar3 = 0x5f;
        iVar6 = iVar3;
      }
    }
    iVar7 = iVar6;
    iVar5 = number_percent();
    if (iVar5 <= iVar7) {
      if (*(long *)(in_RDI + 0x28) == 0) {
        if ((*(long *)(in_RDI + 0x58) != 0) && (*(long *)(*(long *)(in_RDI + 0x58) + 0x18) != 0)) {
          act((char *)CONCAT44(iVar4,in_stack_ffffffffffffff20),ch,(void *)CONCAT44(iVar6,iVar3),
              (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
        }
      }
      else {
        act((char *)CONCAT44(iVar4,in_stack_ffffffffffffff20),ch,(void *)CONCAT44(iVar6,iVar3),
            (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),0);
      }
      if (*(long *)(in_RDI + 0x10) != 0) {
        obj_00 = *(OBJ_DATA **)(in_RDI + 0x10);
        while (obj_00 != (OBJ_DATA *)0x0) {
          pOVar1 = obj_00->next_content;
          obj_from_obj((OBJ_DATA *)CONCAT44(iVar7,in_stack_ffffffffffffff30));
          if (*(long *)(in_RDI + 0x58) == 0) {
            if (*(long *)(in_RDI + 0x28) != 0) {
              obj_to_room(obj_00,*(ROOM_INDEX_DATA **)(*(long *)(in_RDI + 0x28) + 0xa8));
              goto LAB_005cfae6;
            }
            extract_obj((OBJ_DATA *)CONCAT44(iVar7,in_stack_ffffffffffffff30));
            obj_00 = pOVar1;
          }
          else {
            obj_to_room(obj_00,*(ROOM_INDEX_DATA **)(in_RDI + 0x58));
LAB_005cfae6:
            fire_effect((void *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
                        (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
            obj_00 = pOVar1;
          }
        }
      }
      extract_obj((OBJ_DATA *)CONCAT44(iVar7,in_stack_ffffffffffffff30));
    }
  }
  return;
}

Assistant:

void fire_effect(void *vo, int level, int dam, int target)
{
	if (target == TARGET_ROOM) /* nail objects on the floor */
	{
		ROOM_INDEX_DATA *room = (ROOM_INDEX_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		for (obj = room->contents; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;
			fire_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_CHAR) /* do the effect on a victim */
	{
		CHAR_DATA *victim = (CHAR_DATA *)vo;
		OBJ_DATA *obj, *obj_next;

		/* chance of blindness */
		if (!is_affected_by(victim, AFF_BLIND) && !saves_spell(level / 4 + dam / 20, victim, DAM_FIRE))
		{
			AFFECT_DATA af;
			act("$n is blinded by smoke!", victim, nullptr, nullptr, TO_ROOM);
			act("Your eyes tear up from smoke...you can't see a thing!", victim, nullptr, nullptr, TO_CHAR);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SPELL;
			af.type = skill_lookup("fire breath");
			af.level = level;
			af.duration = number_range(0, level / 10);
			af.location = APPLY_HITROLL;
			af.modifier = -4;
			SET_BIT(af.bitvector, AFF_BLIND);

			affect_to_char(victim, &af);
		}

		/* getting thirsty */
		if (!is_npc(victim))
			gain_condition(victim, COND_THIRST, dam / 20);

		/* let's toast some gear! */
		for (obj = victim->carrying; obj != nullptr; obj = obj_next)
		{
			obj_next = obj->next_content;

			fire_effect(obj, level, dam, TARGET_OBJ);
		}

		return;
	}

	if (target == TARGET_OBJ) /* toast an object */
	{
		OBJ_DATA *obj = (OBJ_DATA *)vo;
		OBJ_DATA *t_obj, *n_obj;
		int chance;
		char *msg;

		if (is_obj_stat(obj, ITEM_BURN_PROOF) || is_obj_stat(obj, ITEM_NOPURGE) || number_range(0, 4) == 0)
			return;

		chance = level / 4 + dam / 10;

		if (chance > 25)
			chance = (chance - 25) / 2 + 25;
		if (chance > 50)
			chance = (chance - 50) / 2 + 50;

		if (is_obj_stat(obj, ITEM_BLESS))
			chance -= 5;
		chance -= obj->level * 2;

		switch (obj->item_type)
		{
			case ITEM_CONTAINER:
				msg = "$p ignites and burns!";
				break;
			case ITEM_POTION:
				chance += 25;
				msg = "$p bubbles and boils!";
				break;
			case ITEM_SCROLL:
				chance += 50;
				msg = "$p crackles and burns!";
				break;
			case ITEM_STAFF:
				chance += 10;
				msg = "$p smokes and chars!";
				break;
			case ITEM_WAND:
				msg = "$p sparks and sputters!";
				break;
			case ITEM_FOOD:
				msg = "$p blackens and crisps!";
				break;
			case ITEM_PILL:
				msg = "$p melts and drips!";
				break;
			default:
				return;
		}

		chance = URANGE(5, chance, 95);

		if (number_percent() > chance)
			return;

		if (obj->carried_by != nullptr)
			act(msg, obj->carried_by, obj, nullptr, TO_ALL);
		else if (obj->in_room != nullptr && obj->in_room->people != nullptr)
			act(msg, obj->in_room->people, obj, nullptr, TO_ALL);

		if (obj->contains)
		{
			/* dump the contents */

			for (t_obj = obj->contains; t_obj != nullptr; t_obj = n_obj)
			{
				n_obj = t_obj->next_content;
				obj_from_obj(t_obj);

				if (obj->in_room != nullptr)
				{
					obj_to_room(t_obj, obj->in_room);
				}
				else if (obj->carried_by != nullptr)
				{
					obj_to_room(t_obj, obj->carried_by->in_room);
				}
				else
				{
					extract_obj(t_obj);
					continue;
				}

				fire_effect(t_obj, level / 2, dam / 2, TARGET_OBJ);
			}
		}

		extract_obj(obj);
	}
}